

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O1

void __thiscall cppcms::widgets::hidden::render(hidden *this)

{
  form_context *in_RSI;
  
  render((hidden *)
         ((long)&(this->super_text).super_base_html_input._vptr_base_html_input +
         (long)(this->super_text).super_base_html_input._vptr_base_html_input[-3]),in_RSI);
  return;
}

Assistant:

void hidden::render(form_context &context)
{
	auto_generate(&context);
	std::ostream &output = context.out();
	
	context.widget_part(first_part);
	render_input(context);

	output<<attributes_string();

	context.widget_part(second_part);
	render_input(context);

}